

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lower.cpp
# Opt level: O0

bool __thiscall
Lowerer::GenerateFastStringLdElem
          (Lowerer *this,Instr *ldElem,LabelInstr *labelHelper,LabelInstr *labelFallThru)

{
  code *pcVar1;
  undefined8 uVar2;
  undefined8 baseOpnd_00;
  undefined8 indexOpnd_00;
  bool bVar3;
  BYTE scale;
  int32 iVar4;
  uint uVar5;
  uint32 uVar6;
  DWORD DVar7;
  DWORD DVar8;
  Opnd *pOVar9;
  RegOpnd *dst;
  IndirOpnd *pIVar10;
  IntConstOpnd *pIVar11;
  undefined4 *puVar12;
  byte local_119;
  undefined1 local_110 [8];
  AutoReuseOpnd autoReuseStringOpnd;
  RegOpnd *stringOpnd;
  AutoReuseOpnd autoReuseCacheOpnd;
  RegOpnd *cacheOpnd;
  AutoReuseOpnd autoReuseCharOpnd;
  RegOpnd *charOpnd;
  RegOpnd *maskOpnd;
  RegOpnd *lengthOpnd;
  RegOpnd *index32Opnd;
  IndirOpnd *charIndirOpnd;
  AutoReuseOpnd autoReuseBufferOpnd;
  RegOpnd *bufferOpnd;
  Opnd *index32CmpOpnd;
  RegOpnd *local_50;
  RegOpnd *indexOpnd;
  RegOpnd *local_40;
  RegOpnd *baseOpnd;
  IndirOpnd *indirOpnd;
  LabelInstr *labelFallThru_local;
  LabelInstr *labelHelper_local;
  Instr *ldElem_local;
  Lowerer *this_local;
  
  indirOpnd = (IndirOpnd *)labelFallThru;
  labelFallThru_local = labelHelper;
  labelHelper_local = (LabelInstr *)ldElem;
  ldElem_local = (Instr *)this;
  pOVar9 = IR::Instr::GetSrc1(ldElem);
  baseOpnd = (RegOpnd *)IR::Opnd::AsIndirOpnd(pOVar9);
  local_40 = IR::IndirOpnd::GetBaseOpnd((IndirOpnd *)baseOpnd);
  indexOpnd._6_2_ =
       (anon_struct_2_1_ebef698d_for_anon_union_2_4_ea848c7b_for_ValueType_13_0)
       IR::Opnd::GetValueType(&local_40->super_Opnd);
  bVar3 = ValueType::IsLikelyString((ValueType *)((long)&indexOpnd + 6));
  if (((bVar3 ^ 0xffU) & 1) == 0) {
    bVar3 = IR::Opnd::IsTaggedInt(&local_40->super_Opnd);
    if (bVar3) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar12 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar12 = 1;
      bVar3 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                         ,0x468c,"(!baseOpnd->IsTaggedInt())","!baseOpnd->IsTaggedInt()");
      if (!bVar3) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      puVar12 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar12 = 0;
    }
    local_50 = IR::IndirOpnd::GetIndexOpnd((IndirOpnd *)baseOpnd);
    local_119 = 0;
    if (local_50 != (RegOpnd *)0x0) {
      index32CmpOpnd._6_2_ =
           (anon_struct_2_1_ebef698d_for_anon_union_2_4_ea848c7b_for_ValueType_13_0)
           IR::Opnd::GetValueType(&local_50->super_Opnd);
      bVar3 = ValueType::IsLikelyInt((ValueType *)((long)&index32CmpOpnd + 6));
      local_119 = bVar3 ^ 0xff;
    }
    if ((local_119 & 1) == 0) {
      if ((local_50 != (RegOpnd *)0x0) && (bVar3 = IR::Opnd::IsNotInt(&local_50->super_Opnd), bVar3)
         ) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar12 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar12 = 1;
        bVar3 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                           ,0x4696,"(!indexOpnd || !indexOpnd->IsNotInt())",
                           "!indexOpnd || !indexOpnd->IsNotInt()");
        if (!bVar3) {
          pcVar1 = (code *)invalidInstructionException();
          (*pcVar1)();
        }
        puVar12 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar12 = 0;
      }
      GenerateStringTest(this,local_40,&labelHelper_local->super_Instr,labelFallThru_local,
                         (LabelInstr *)0x0,true);
      autoReuseBufferOpnd._16_8_ = IR::RegOpnd::New(TyUint64,this->m_func);
      IR::AutoReuseOpnd::AutoReuseOpnd
                ((AutoReuseOpnd *)&charIndirOpnd,(Opnd *)autoReuseBufferOpnd._16_8_,this->m_func,
                 true);
      uVar2 = autoReuseBufferOpnd._16_8_;
      if (local_50 == (RegOpnd *)0x0) {
        iVar4 = IR::IndirOpnd::GetOffset((IndirOpnd *)baseOpnd);
        index32Opnd = (RegOpnd *)
                      IR::IndirOpnd::New((RegOpnd *)uVar2,iVar4 * 2,TyUint16,this->m_func,false);
        uVar5 = IR::IndirOpnd::GetOffset((IndirOpnd *)baseOpnd);
        bufferOpnd = (RegOpnd *)IR::IntConstOpnd::New((ulong)uVar5,TyUint32,this->m_func,false);
      }
      else {
        bufferOpnd = GenerateUntagVar(this,local_50,labelFallThru_local,
                                      &labelHelper_local->super_Instr,true);
        index32Opnd = (RegOpnd *)
                      IR::IndirOpnd::New((RegOpnd *)autoReuseBufferOpnd._16_8_,bufferOpnd,'\x01',
                                         TyUint16,this->m_func);
      }
      dst = IR::RegOpnd::New(TyUint32,this->m_func);
      pIVar10 = IR::IndirOpnd::New(local_40,0x18,TyUint32,this->m_func,false);
      InsertMove(&dst->super_Opnd,&pIVar10->super_Opnd,&labelHelper_local->super_Instr,true);
      InsertCompareBranch(this,&dst->super_Opnd,&bufferOpnd->super_Opnd,BrLe_A,true,
                          labelFallThru_local,&labelHelper_local->super_Instr,false);
      baseOpnd = (RegOpnd *)IR::IndirOpnd::New(local_40,0x10,TyUint64,this->m_func,false);
      InsertMove((Opnd *)autoReuseBufferOpnd._16_8_,(Opnd *)baseOpnd,&labelHelper_local->super_Instr
                 ,true);
      GenerateNotZeroTest(this,(Opnd *)autoReuseBufferOpnd._16_8_,labelFallThru_local,
                          &labelHelper_local->super_Instr);
      charOpnd = (RegOpnd *)0x0;
      if ((DAT_01eafd1f & 1) != 0) {
        bVar3 = IR::Opnd::IsIntConstOpnd(&bufferOpnd->super_Opnd);
        if (bVar3) {
          pIVar11 = IR::Opnd::AsIntConstOpnd(&bufferOpnd->super_Opnd);
          uVar6 = IR::IntConstOpnd::AsUint32(pIVar11);
          IR::IndirOpnd::SetOffset((IndirOpnd *)index32Opnd,uVar6 * 2,false);
        }
        else {
          pIVar11 = IR::IntConstOpnd::New(0x7fffffff,TyInt32,this->m_func,false);
          InsertAnd(&bufferOpnd->super_Opnd,&bufferOpnd->super_Opnd,&pIVar11->super_Opnd,
                    &labelHelper_local->super_Instr);
        }
        charOpnd = IR::RegOpnd::New(TyInt32,this->m_func);
        InsertSub(false,&charOpnd->super_Opnd,&bufferOpnd->super_Opnd,&dst->super_Opnd,
                  &labelHelper_local->super_Instr);
        pIVar11 = IR::IntConstOpnd::New(0x1f,TyInt8,this->m_func,false);
        InsertShift(Shr_A,false,&charOpnd->super_Opnd,&charOpnd->super_Opnd,&pIVar11->super_Opnd,
                    &labelHelper_local->super_Instr);
      }
      autoReuseCharOpnd._16_8_ = IR::RegOpnd::New(TyUint32,this->m_func);
      IR::AutoReuseOpnd::AutoReuseOpnd
                ((AutoReuseOpnd *)&cacheOpnd,(Opnd *)autoReuseCharOpnd._16_8_,this->m_func,true);
      InsertMove((Opnd *)autoReuseCharOpnd._16_8_,&index32Opnd->super_Opnd,
                 &labelHelper_local->super_Instr,true);
      if ((DAT_01eafd1f & 1) != 0) {
        InsertAnd((Opnd *)autoReuseCharOpnd._16_8_,(Opnd *)autoReuseCharOpnd._16_8_,
                  &charOpnd->super_Opnd,&labelHelper_local->super_Instr);
      }
      uVar2 = autoReuseCharOpnd._16_8_;
      pIVar11 = IR::IntConstOpnd::New(0x80,TyUint16,this->m_func,false);
      InsertCompareBranch(this,(Opnd *)uVar2,&pIVar11->super_Opnd,BrGe_A,true,labelFallThru_local,
                          &labelHelper_local->super_Instr,false);
      autoReuseCacheOpnd._16_8_ = IR::RegOpnd::New(TyUint64,this->m_func);
      IR::AutoReuseOpnd::AutoReuseOpnd
                ((AutoReuseOpnd *)&stringOpnd,(Opnd *)autoReuseCacheOpnd._16_8_,this->m_func,true);
      DVar7 = Js::JavascriptLibrary::GetCharStringCacheAOffset();
      DVar8 = Js::JavascriptLibrary::GetCharStringCacheOffset();
      if (DVar7 != DVar8) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar12 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar12 = 1;
        bVar3 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                           ,0x46e5,
                           "(Js::JavascriptLibrary::GetCharStringCacheAOffset() == Js::JavascriptLibrary::GetCharStringCacheOffset())"
                           ,
                           "Js::JavascriptLibrary::GetCharStringCacheAOffset() == Js::JavascriptLibrary::GetCharStringCacheOffset()"
                          );
        if (!bVar3) {
          pcVar1 = (code *)invalidInstructionException();
          (*pcVar1)();
        }
        puVar12 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar12 = 0;
      }
      uVar2 = autoReuseCacheOpnd._16_8_;
      pOVar9 = LoadLibraryValueOpnd(this,&labelHelper_local->super_Instr,ValueCharStringCache);
      InsertMove((Opnd *)uVar2,pOVar9,&labelHelper_local->super_Instr,true);
      autoReuseStringOpnd._16_8_ = IR::RegOpnd::New(TyUint64,this->m_func);
      IR::AutoReuseOpnd::AutoReuseOpnd
                ((AutoReuseOpnd *)local_110,(Opnd *)autoReuseStringOpnd._16_8_,this->m_func,true);
      indexOpnd_00 = autoReuseCharOpnd._16_8_;
      baseOpnd_00 = autoReuseCacheOpnd._16_8_;
      uVar2 = autoReuseStringOpnd._16_8_;
      scale = LowererMD::GetDefaultIndirScale();
      pIVar10 = IR::IndirOpnd::New((RegOpnd *)baseOpnd_00,(RegOpnd *)indexOpnd_00,scale,TyVar,
                                   this->m_func);
      InsertMove((Opnd *)uVar2,&pIVar10->super_Opnd,&labelHelper_local->super_Instr,true);
      GenerateNotZeroTest(this,(Opnd *)autoReuseStringOpnd._16_8_,labelFallThru_local,
                          &labelHelper_local->super_Instr);
      pOVar9 = IR::Instr::GetDst(&labelHelper_local->super_Instr);
      InsertMove(pOVar9,(Opnd *)autoReuseStringOpnd._16_8_,&labelHelper_local->super_Instr,true);
      InsertBranch(Br,(LabelInstr *)indirOpnd,&labelHelper_local->super_Instr);
      this_local._7_1_ = 1;
      IR::AutoReuseOpnd::~AutoReuseOpnd((AutoReuseOpnd *)local_110);
      IR::AutoReuseOpnd::~AutoReuseOpnd((AutoReuseOpnd *)&stringOpnd);
      IR::AutoReuseOpnd::~AutoReuseOpnd((AutoReuseOpnd *)&cacheOpnd);
      IR::AutoReuseOpnd::~AutoReuseOpnd((AutoReuseOpnd *)&charIndirOpnd);
    }
    else {
      this_local._7_1_ = 0;
    }
  }
  else {
    this_local._7_1_ = 0;
  }
  return (bool)(this_local._7_1_ & 1);
}

Assistant:

bool
Lowerer::GenerateFastStringLdElem(IR::Instr * ldElem, IR::LabelInstr * labelHelper, IR::LabelInstr * labelFallThru)
{
    IR::IndirOpnd * indirOpnd = ldElem->GetSrc1()->AsIndirOpnd();
    IR::RegOpnd * baseOpnd = indirOpnd->GetBaseOpnd();

    // don't generate the fast path if the instance is not likely string
    if (!baseOpnd->GetValueType().IsLikelyString())
    {
        return false;
    }

    Assert(!baseOpnd->IsTaggedInt());

    IR::RegOpnd * indexOpnd = indirOpnd->GetIndexOpnd();
    // Don't generate the fast path if the index operand is not likely int
    if (indexOpnd && !indexOpnd->GetValueType().IsLikelyInt())
    {
        return false;
    }

    // Make sure the instance is a string
    Assert(!indexOpnd || !indexOpnd->IsNotInt());
    GenerateStringTest(baseOpnd, ldElem, labelHelper);

    IR::Opnd * index32CmpOpnd;
    IR::RegOpnd * bufferOpnd = IR::RegOpnd::New(TyMachPtr, this->m_func);
    const IR::AutoReuseOpnd autoReuseBufferOpnd(bufferOpnd, m_func);
    IR::IndirOpnd * charIndirOpnd;
    if (indexOpnd)
    {
        // Untag the var and generate the indir into the string buffer
        IR::RegOpnd * index32Opnd = GenerateUntagVar(indexOpnd, labelHelper, ldElem);
        charIndirOpnd = IR::IndirOpnd::New(bufferOpnd, index32Opnd, 1, TyUint16, this->m_func);
        index32CmpOpnd = index32Opnd;
    }
    else
    {
        // Just use the offset to indirect into the string buffer
        charIndirOpnd = IR::IndirOpnd::New(bufferOpnd, indirOpnd->GetOffset() * sizeof(char16), TyUint16, this->m_func);
        index32CmpOpnd = IR::IntConstOpnd::New((uint32)indirOpnd->GetOffset(), TyUint32, this->m_func);
    }

    // Check if the index is in range of the string length
    //  CMP [baseOpnd + offset(length)], indexOpnd     --  string length
    //  JBE $helper                                    -- unsigned compare, and string length are at most INT_MAX - 1
    //                                                 -- so that even if we have a negative index, this will fail
    IR::RegOpnd* lengthOpnd = IR::RegOpnd::New(TyUint32, m_func);
    InsertMove(lengthOpnd, IR::IndirOpnd::New(baseOpnd, offsetof(Js::JavascriptString, m_charLength), TyUint32, this->m_func), ldElem);
    InsertCompareBranch(lengthOpnd, index32CmpOpnd, Js::OpCode::BrLe_A, true, labelHelper, ldElem);

    // Load the string buffer and make sure it is not null
    //  MOV bufferOpnd, [baseOpnd + offset(m_pszValue)]
    //  TEST bufferOpnd, bufferOpnd
    //  JEQ $labelHelper
    indirOpnd = IR::IndirOpnd::New(baseOpnd, offsetof(Js::JavascriptString, m_pszValue), TyMachPtr, this->m_func);

    InsertMove(bufferOpnd, indirOpnd, ldElem);
    GenerateNotZeroTest(bufferOpnd, labelHelper, ldElem);

    IR::RegOpnd* maskOpnd = nullptr;
    if (CONFIG_FLAG_RELEASE(PoisonStringLoad))
    {
        // Mask off the sign before loading so that poisoning will work for negative indices
        if (index32CmpOpnd->IsIntConstOpnd())
        {
            charIndirOpnd->SetOffset((index32CmpOpnd->AsIntConstOpnd()->AsUint32() & INT32_MAX) * sizeof(char16));
        }
        else
        {
            InsertAnd(index32CmpOpnd, index32CmpOpnd, IR::IntConstOpnd::New(INT32_MAX, TyInt32, m_func), ldElem);
        }

        // All bits in mask will be 1 for a valid index or 0 for an OOB index
        maskOpnd = IR::RegOpnd::New(TyInt32, m_func);
        InsertSub(false, maskOpnd, index32CmpOpnd, lengthOpnd, ldElem);
        InsertShift(Js::OpCode::Shr_A, false, maskOpnd, maskOpnd, IR::IntConstOpnd::New(31, TyInt8, m_func), ldElem);
    }

    // Load the character and check if it is 7bit ASCI (which we have the cache for)
    //  MOV charOpnd, [bufferOpnd + index32Opnd]
    //  CMP charOpnd, 0x80
    //  JAE $helper
    IR::RegOpnd * charOpnd = IR::RegOpnd::New(TyUint32, this->m_func);
    const IR::AutoReuseOpnd autoReuseCharOpnd(charOpnd, m_func);
    InsertMove(charOpnd, charIndirOpnd, ldElem);

    if (CONFIG_FLAG_RELEASE(PoisonStringLoad))
    {
        InsertAnd(charOpnd, charOpnd, maskOpnd, ldElem);
    }

    InsertCompareBranch(charOpnd, IR::IntConstOpnd::New(Js::CharStringCache::CharStringCacheSize, TyUint16, this->m_func),
        Js::OpCode::BrGe_A, true, labelHelper, ldElem);

    // Load the string from the cache
    //  MOV charStringCache, <charStringCache, address>
    //  MOV stringOpnd, [charStringCache + charOpnd * 4]

    IR::RegOpnd * cacheOpnd = IR::RegOpnd::New(TyMachPtr, this->m_func);
    const IR::AutoReuseOpnd autoReuseCacheOpnd(cacheOpnd, m_func);
    Assert(Js::JavascriptLibrary::GetCharStringCacheAOffset() == Js::JavascriptLibrary::GetCharStringCacheOffset());
    InsertMove(cacheOpnd, this->LoadLibraryValueOpnd(ldElem,  LibraryValue::ValueCharStringCache), ldElem);

    // Check if we have created the string or not
    //  TEST stringOpnd, stringOpnd
    //  JE $helper
    IR::RegOpnd * stringOpnd =  IR::RegOpnd::New(TyMachPtr, this->m_func);
    const IR::AutoReuseOpnd autoReuseStringOpnd(stringOpnd, m_func);
    InsertMove(stringOpnd, IR::IndirOpnd::New(cacheOpnd, charOpnd, this->m_lowererMD.GetDefaultIndirScale(), TyVar, this->m_func), ldElem);

    GenerateNotZeroTest(stringOpnd, labelHelper, ldElem);

    InsertMove(ldElem->GetDst(), stringOpnd, ldElem);
    InsertBranch(Js::OpCode::Br, labelFallThru, ldElem);

    return true;
}